

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O0

int ndn_name_tlv_encode(ndn_encoder_t *encoder,ndn_name_t *name)

{
  long lVar1;
  size_t sVar2;
  ndn_name_t *pnVar3;
  uint32_t uVar4;
  name_component_t *pnVar5;
  undefined8 uStack_70;
  long local_68;
  int local_5c;
  ulong uStack_58;
  int result;
  size_t i_1;
  size_t i;
  size_t value_size;
  ulong local_38;
  unsigned_long __vla_expr0;
  undefined4 local_24;
  ndn_name_t *pnStack_20;
  int ret_val;
  ndn_name_t *name_local;
  ndn_encoder_t *encoder_local;
  
  __vla_expr0 = (unsigned_long)&local_68;
  local_24 = 0xffffffff;
  local_38 = (ulong)name->components_size;
  lVar1 = -(ulong)((uint)name->components_size * 4 + 0xf & 0xfffffff0);
  local_68 = (long)&local_68 + lVar1;
  pnStack_20 = name;
  name_local = (ndn_name_t *)encoder;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f6e8;
  encoder_local._4_4_ = encoder_append_type(encoder,7);
  if (encoder_local._4_4_ == 0) {
    i = 0;
    local_24 = 0;
    for (i_1 = 0; pnVar3 = name_local, sVar2 = i, i_1 < pnStack_20->components_size; i_1 = i_1 + 1)
    {
      pnVar5 = pnStack_20->components + i_1;
      *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f738;
      uVar4 = name_component_probe_block_size(pnVar5);
      *(uint32_t *)(local_68 + i_1 * 4) = uVar4;
      i = (long)*(int *)(local_68 + i_1 * 4) + i;
    }
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f772;
    encoder_local._4_4_ = encoder_append_length((ndn_encoder_t *)pnVar3,(uint32_t)sVar2);
    if (encoder_local._4_4_ == 0) {
      local_24 = 0;
      for (uStack_58 = 0; pnVar3 = name_local, uStack_58 < pnStack_20->components_size;
          uStack_58 = uStack_58 + 1) {
        pnVar5 = pnStack_20->components + uStack_58;
        *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f7bb;
        local_5c = name_component_tlv_encode((ndn_encoder_t *)pnVar3,pnVar5);
        if (local_5c < 0) {
          return local_5c;
        }
      }
      encoder_local._4_4_ = 0;
    }
  }
  return encoder_local._4_4_;
}

Assistant:

int
ndn_name_tlv_encode(ndn_encoder_t* encoder, const ndn_name_t *name)
{
  int ret_val = -1;
  int block_sizes[name->components_size];
  ret_val = encoder_append_type(encoder, TLV_Name);
  if (ret_val != NDN_SUCCESS) return ret_val;
  size_t value_size = 0;
  for (size_t i = 0; i < name->components_size; i++) {
    block_sizes[i] = name_component_probe_block_size(&name->components[i]);
    value_size += block_sizes[i];
  }
  ret_val = encoder_append_length(encoder, value_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  for (size_t i = 0; i < name->components_size; i++) {
    int result = name_component_tlv_encode(encoder, &name->components[i]);
    if (result < 0)
      return result;
  }
  return 0;
}